

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateExecutingEntryCallback
               (HelicsFederate fed,_func_void_void_ptr *executingEntry,void *userdata,
               HelicsError *err)

{
  Federate *pFVar1;
  Federate *in_RDX;
  function<void_()> *in_RSI;
  Federate *fedptr;
  function<void_()> *in_stack_ffffffffffffff60;
  HelicsError *in_stack_ffffffffffffff68;
  function<void_()> *in_stack_ffffffffffffff70;
  function<void_()> *in_stack_ffffffffffffff78;
  Federate *in_stack_ffffffffffffff80;
  
  pFVar1 = getFed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == (function<void_()> *)0x0) {
      std::function<void_()>::function(in_stack_ffffffffffffff60);
      helics::Federate::setExecutingEntryCallback
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::function<void_()>::~function((function<void_()> *)0x1bd236);
    }
    else {
      std::function<void()>::function<helicsFederateExecutingEntryCallback::__0,void>
                (in_stack_ffffffffffffff70,(anon_class_16_2_852d112e *)in_stack_ffffffffffffff68);
      helics::Federate::setExecutingEntryCallback(in_RDX,in_RSI);
      std::function<void_()>::~function((function<void_()> *)0x1bd2a9);
    }
  }
  return;
}

Assistant:

void helicsFederateExecutingEntryCallback(HelicsFederate fed, void (*executingEntry)(void* userdata), void* userdata, HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (executingEntry == nullptr) {
            fedptr->setExecutingEntryCallback({});
        } else {
            fedptr->setExecutingEntryCallback([executingEntry, userdata]() { executingEntry(userdata); });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}